

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.cpp
# Opt level: O1

void __thiscall InliningThreshold::SetHeuristics(InliningThreshold *this)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = DAT_015b5ff4;
  this->inlineThreshold = DAT_015b5ff4;
  uVar1 = this->nonLoadByteCodeCount;
  if (uVar1 < 0x321) {
    if (uVar1 < 0xc9) {
      if (0x31 < uVar1) goto LAB_00566762;
      iVar2 = iVar2 + DAT_015b6008;
    }
    else {
      iVar2 = iVar2 - DAT_015b6004;
    }
  }
  else {
    iVar2 = iVar2 - DAT_015b6000;
  }
  this->inlineThreshold = iVar2;
LAB_00566762:
  if (this->asmjs == true) {
    this->inlineThreshold = this->inlineThreshold + DAT_015b600c;
  }
  this->constructorInlineThreshold = DAT_015aa3bc;
  this->outsideLoopInlineThreshold = DAT_015b8ef4;
  this->leafInlineThreshold = DAT_015b8ecc;
  this->loopInlineThreshold = DAT_015b8ec8;
  this->polymorphicInlineThreshold = DAT_015bbda0;
  this->maxNumberOfInlineesWithLoop = DAT_015b8efc;
  this->constantArgumentInlineThreshold = DAT_015b8ed0;
  this->inlineCountMax = (&DAT_015b5fe0)[this->forLoopBody];
  return;
}

Assistant:

void InliningThreshold::SetHeuristics()
{
    inlineThreshold = CONFIG_FLAG(InlineThreshold);
    // Inline less aggressively in large functions since the register pressure is likely high.
    // Small functions shouldn't be a problem.
    if (nonLoadByteCodeCount > 800)
    {
        inlineThreshold -= CONFIG_FLAG(InlineThresholdAdjustCountInLargeFunction);
    }
    else if (nonLoadByteCodeCount > 200)
    {
        inlineThreshold -= CONFIG_FLAG(InlineThresholdAdjustCountInMediumSizedFunction);
    }
    else if (nonLoadByteCodeCount < 50)
    {
        inlineThreshold += CONFIG_FLAG(InlineThresholdAdjustCountInSmallFunction);
    }
    if (this->asmjs)
    {
        inlineThreshold += CONFIG_FLAG(AsmJsInlineAdjust);
    }

    constructorInlineThreshold = CONFIG_FLAG(ConstructorInlineThreshold);
    outsideLoopInlineThreshold = CONFIG_FLAG(OutsideLoopInlineThreshold);
    leafInlineThreshold = CONFIG_FLAG(LeafInlineThreshold);
    loopInlineThreshold = CONFIG_FLAG(LoopInlineThreshold);
    polymorphicInlineThreshold = CONFIG_FLAG(PolymorphicInlineThreshold);
    maxNumberOfInlineesWithLoop = CONFIG_FLAG(MaxNumberOfInlineesWithLoop);
    constantArgumentInlineThreshold = CONFIG_FLAG(ConstantArgumentInlineThreshold);
    inlineCountMax = !forLoopBody ? CONFIG_FLAG(InlineCountMax) : CONFIG_FLAG(InlineCountMaxInLoopBodies);
}